

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O3

void __thiscall
Js::JavascriptPromise::MarkVisitKindSpecificPtrs
          (JavascriptPromise *this,SnapshotExtractor *extractor)

{
  Var var;
  JavascriptPromiseReaction *this_00;
  code *pcVar1;
  SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *pSVar2;
  bool bVar3;
  undefined4 *puVar4;
  Type *pTVar5;
  SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *pSVar6;
  Iterator local_48;
  Type local_38;
  
  var = (this->result).ptr;
  if (var != (Var)0x0) {
    TTD::SnapshotExtractor::MarkVisitVar(extractor,var);
  }
  pSVar6 = (this->reactions).ptr;
  if (pSVar6 != (SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)0x0) {
    local_48.list =
         &pSVar6->super_SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>;
    local_48.current = (NodeBase *)pSVar6;
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    while( true ) {
      if (pSVar6 == (SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar4 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                    ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
        pSVar6 = (SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)
                 local_48.current;
      }
      pSVar2 = local_48.list;
      pSVar6 = (SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)
               (pSVar6->
               super_SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>).
               super_SListNodeBase<Memory::Recycler>.next.ptr;
      Memory::Recycler::WBSetBit((char *)&local_38);
      local_38.ptr = (SListNodeBase<Memory::Recycler> *)pSVar6;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_38);
      if ((SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)local_38.ptr
          == pSVar2) break;
      pSVar6 = (SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)
               (((SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)
                &(local_48.current)->next)->super_SListNodeBase<Memory::Recycler>).next.ptr;
      Memory::Recycler::WBSetBit((char *)&local_38);
      local_38.ptr = (SListNodeBase<Memory::Recycler> *)pSVar6;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_38);
      local_48.current = local_38.ptr;
      pTVar5 = SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>::Iterator::
               Data(&local_48);
      this_00 = pTVar5->resolveReaction;
      JavascriptPromiseReaction::MarkVisitPtrs(pTVar5->rejectReaction,extractor);
      JavascriptPromiseReaction::MarkVisitPtrs(this_00,extractor);
      pSVar6 = (SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)
               local_48.current;
    }
  }
  return;
}

Assistant:

void JavascriptPromise::MarkVisitKindSpecificPtrs(TTD::SnapshotExtractor* extractor)
    {
        if(this->result != nullptr)
        {
            extractor->MarkVisitVar(this->result);
        }

        if(this->reactions != nullptr)
        {
            this->reactions->Map([&](JavascriptPromiseReactionPair pair) {
                pair.rejectReaction->MarkVisitPtrs(extractor);
                pair.resolveReaction->MarkVisitPtrs(extractor);
            });
        }
    }